

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restore.c
# Opt level: O3

int dorecover_fd(int infd)

{
  int iVar1;
  __off_t __offset;
  int iVar2;
  memfile mf;
  memfile local_1fe8;
  
  mnew(&local_1fe8,(memfile *)0x0);
  restoring = '\x01';
  __offset = lseek(infd,0,1);
  local_1fe8.buf = loadfile(infd,&local_1fe8.len);
  iVar2 = 0;
  if (local_1fe8.buf != (char *)0x0) {
    iVar1 = dorecover(&local_1fe8);
    mfree(&local_1fe8);
    iVar2 = 0;
    if (iVar1 != 0) {
      lseek(infd,__offset,0);
      ftruncate(infd,__offset);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int dorecover_fd(int infd)
{
	int ret;
	struct memfile mf;
	long initial_pos;

	mnew(&mf, NULL);

	restoring = TRUE;

	initial_pos = lseek(infd, 0, SEEK_CUR);
	mf.buf = loadfile(infd, &mf.len);
	if (!mf.buf)
	    return 0;
	
	ret = dorecover(&mf);
	mfree(&mf);
	
	if (ret) {
	    /* erase the binary portion of the logfile */
	    lseek(infd, initial_pos, SEEK_SET);
	    ftruncate(infd, initial_pos);
	}
	
	return ret;
}